

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttobjs.c
# Opt level: O0

FT_Error tt_size_run_prep(TT_Size size,FT_Bool pedantic)

{
  TT_Face face_00;
  TT_ExecContext exec_00;
  FT_Error local_34;
  FT_Error error;
  TT_ExecContext exec;
  TT_Face face;
  FT_Bool pedantic_local;
  TT_Size size_local;
  
  face_00 = (TT_Face)(size->root).face;
  exec_00 = size->context;
  size_local._4_4_ = TT_Load_Context(exec_00,face_00,size);
  if (size_local._4_4_ == 0) {
    exec_00->callTop = 0;
    exec_00->top = 0;
    exec_00->instruction_trap = '\0';
    exec_00->pedantic_hinting = pedantic;
    TT_Set_CodeRange(exec_00,2,face_00->cvt_program,face_00->cvt_program_size);
    TT_Clear_CodeRange(exec_00,3);
    if (face_00->cvt_program_size == 0) {
      local_34 = 0;
    }
    else {
      TT_Goto_CodeRange(exec_00,2,0);
      local_34 = (*face_00->interpreter)(exec_00);
    }
    size->cvt_ready = local_34;
    (exec_00->GS).dualVector.x = 0x4000;
    (exec_00->GS).dualVector.y = 0;
    (exec_00->GS).projVector.x = 0x4000;
    (exec_00->GS).projVector.y = 0;
    (exec_00->GS).freeVector.x = 0x4000;
    (exec_00->GS).freeVector.y = 0;
    (exec_00->GS).rp0 = 0;
    (exec_00->GS).rp1 = 0;
    (exec_00->GS).rp2 = 0;
    (exec_00->GS).gep0 = 1;
    (exec_00->GS).gep1 = 1;
    (exec_00->GS).gep2 = 1;
    (exec_00->GS).loop = 1;
    memcpy(&size->GS,&exec_00->GS,0x60);
    TT_Save_Context(exec_00,size);
    size_local._4_4_ = local_34;
  }
  return size_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_size_run_prep( TT_Size  size,
                    FT_Bool  pedantic )
  {
    TT_Face         face = (TT_Face)size->root.face;
    TT_ExecContext  exec;
    FT_Error        error;


    exec = size->context;

    error = TT_Load_Context( exec, face, size );
    if ( error )
      return error;

    exec->callTop = 0;
    exec->top     = 0;

    exec->instruction_trap = FALSE;

    exec->pedantic_hinting = pedantic;

    TT_Set_CodeRange( exec,
                      tt_coderange_cvt,
                      face->cvt_program,
                      (FT_Long)face->cvt_program_size );

    TT_Clear_CodeRange( exec, tt_coderange_glyph );

    if ( face->cvt_program_size > 0 )
    {
      TT_Goto_CodeRange( exec, tt_coderange_cvt, 0 );

      FT_TRACE4(( "Executing `prep' table.\n" ));
      error = face->interpreter( exec );
#ifdef FT_DEBUG_LEVEL_TRACE
      if ( error )
        FT_TRACE4(( "  interpretation failed with error code 0x%x\n",
                    error ));
#endif
    }
    else
      error = FT_Err_Ok;

    size->cvt_ready = error;

    /* UNDOCUMENTED!  The MS rasterizer doesn't allow the following */
    /* graphics state variables to be modified by the CVT program.  */

    exec->GS.dualVector.x = 0x4000;
    exec->GS.dualVector.y = 0;
    exec->GS.projVector.x = 0x4000;
    exec->GS.projVector.y = 0x0;
    exec->GS.freeVector.x = 0x4000;
    exec->GS.freeVector.y = 0x0;

    exec->GS.rp0 = 0;
    exec->GS.rp1 = 0;
    exec->GS.rp2 = 0;

    exec->GS.gep0 = 1;
    exec->GS.gep1 = 1;
    exec->GS.gep2 = 1;

    exec->GS.loop = 1;

    /* save as default graphics state */
    size->GS = exec->GS;

    TT_Save_Context( exec, size );

    return error;
  }